

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

If_DsdMan_t * If_DsdManFilter(If_DsdMan_t *p,int Limit)

{
  uint uVar1;
  If_DsdMan_t *pNew;
  Vec_Int_t *vMap;
  int *__s;
  uint uVar2;
  long lVar3;
  
  pNew = If_DsdManAlloc(p->nVars,p->LutSize);
  uVar2 = (p->vObjs).nSize;
  vMap = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar2 - 1) {
    uVar1 = uVar2;
  }
  vMap->nCap = uVar1;
  if (uVar1 == 0) {
    vMap->pArray = (int *)0x0;
    vMap->nSize = uVar2;
  }
  else {
    __s = (int *)malloc((long)(int)uVar1 << 2);
    vMap->pArray = __s;
    vMap->nSize = uVar2;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)(int)uVar2 << 2);
      goto LAB_004240e4;
    }
  }
  __s = (int *)0x0;
LAB_004240e4:
  if ((0 < (int)uVar2) && (*__s = 0, uVar2 != 1)) {
    __s[1] = 1;
    if (2 < uVar2) {
      lVar3 = 2;
      do {
        if (Limit <= (int)(*(uint *)((long)(p->vObjs).pArray[lVar3] + 4) >> 9 & 0x3ffff)) {
          If_DsdManFilter_rec(pNew,p,(int)lVar3,vMap);
          uVar2 = (p->vObjs).nSize;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (int)uVar2);
    }
    free(__s);
    free(vMap);
    return pNew;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

If_DsdMan_t * If_DsdManFilter( If_DsdMan_t * p, int Limit )
{
    If_DsdMan_t * pNew = If_DsdManAlloc( p->nVars, p->LutSize );
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int i;
    vMap = Vec_IntStartFull( Vec_PtrSize(&p->vObjs) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
        if ( (int)pObj->Count >= Limit )
            If_DsdManFilter_rec( pNew, p, i, vMap );
    Vec_IntFree( vMap );
    return pNew;
}